

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo_p.h
# Opt level: O0

void __thiscall QFileInfoPrivate::clear(QFileInfoPrivate *this)

{
  QFileInfoPrivate *unaff_retaddr;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  QFileSystemMetaData::clear
            ((QFileSystemMetaData *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  clearFlags(unaff_retaddr);
  for (iVar1 = 10; -1 < iVar1; iVar1 = iVar1 + -1) {
    QString::clear((QString *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  QString::clear((QString *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  QString::clear((QString *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

inline void clear() {
        metaData.clear();
        clearFlags();
        for (int i = QAbstractFileEngine::NFileNames - 1 ; i >= 0 ; --i)
            fileNames[i].clear();
        fileOwners[1].clear();
        fileOwners[0].clear();
    }